

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char * fmt::v5::internal::format_decimal<unsigned_long,char,fmt::v5::internal::no_thousands_sep>
                 (long buffer,ulong value,uint num_digits)

{
  byte bVar1;
  undefined1 *puVar2;
  long lStack_10;
  
  if (-1 < (int)num_digits) {
    puVar2 = (undefined1 *)(buffer + (ulong)num_digits + -1);
    for (; 99 < value; value = value / 100) {
      *(undefined2 *)(puVar2 + -1) = *(undefined2 *)(basic_data<void>::DIGITS + (value % 100) * 2);
      puVar2 = puVar2 + -2;
    }
    if (value < 10) {
      bVar1 = (byte)value | 0x30;
      lStack_10 = -1;
    }
    else {
      *puVar2 = basic_data<void>::DIGITS[(value * 2 & 0xffffffff) + 1];
      bVar1 = basic_data<void>::DIGITS[value * 2 & 0x1fffffffe];
      lStack_10 = -2;
    }
    puVar2[lStack_10 + 1] = bVar1;
    return (char *)(buffer + (ulong)num_digits);
  }
  __assert_fail("(num_digits >= 0) && \"invalid digit count\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/tinfoilboy[P]sonne/extern/fmt/include/fmt/format.h"
                ,0x3c0,
                "Char *fmt::internal::format_decimal(Char *, UInt, int, ThousandsSep) [UInt = unsigned long, Char = char, ThousandsSep = fmt::internal::no_thousands_sep]"
               );
}

Assistant:

inline Char *format_decimal(Char *buffer, UInt value, int num_digits,
                            ThousandsSep thousands_sep) {
  FMT_ASSERT(num_digits >= 0, "invalid digit count");
  buffer += num_digits;
  Char *end = buffer;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    unsigned index = static_cast<unsigned>((value % 100) * 2);
    value /= 100;
    *--buffer = static_cast<Char>(data::DIGITS[index + 1]);
    thousands_sep(buffer);
    *--buffer = static_cast<Char>(data::DIGITS[index]);
    thousands_sep(buffer);
  }
  if (value < 10) {
    *--buffer = static_cast<Char>('0' + value);
    return end;
  }
  unsigned index = static_cast<unsigned>(value * 2);
  *--buffer = static_cast<Char>(data::DIGITS[index + 1]);
  thousands_sep(buffer);
  *--buffer = static_cast<Char>(data::DIGITS[index]);
  return end;
}